

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::HDWallet::GetMnemonicWordlist
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *language)

{
  bool bVar1;
  CfdException *this;
  allocator local_39;
  undefined1 local_38 [32];
  
  bVar1 = CheckSupportedLanguages(language);
  if (bVar1) {
    WallyUtil::GetMnemonicWordlist(__return_storage_ptr__,language);
    return __return_storage_ptr__;
  }
  local_38._0_8_ = "cfdcore_hdwallet.cpp";
  local_38._8_4_ = 0x15a;
  local_38._16_8_ = "GetMnemonicWordlist";
  logger::warn<std::__cxx11::string_const&>
            ((CfdSourceLocation *)local_38,"Not support language passed. language=[{}]",language);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"Not support language passed.",&local_39);
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_38);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<std::string> HDWallet::GetMnemonicWordlist(
    const std::string& language) {
  if (!CheckSupportedLanguages(language)) {
    warn(
        CFD_LOG_SOURCE, "Not support language passed. language=[{}]",
        language);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Not support language passed.");
  }

  return WallyUtil::GetMnemonicWordlist(language);
}